

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  UserData udata;
  N_Vector y;
  undefined8 *puVar5;
  N_Vector p_Var6;
  long lVar7;
  long lVar8;
  FILE *YFID;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  undefined4 uVar12;
  void *cvode_mem;
  sunrealtype t;
  SUNContext sunctx;
  sunrealtype ec;
  void *local_90;
  sunrealtype local_88;
  undefined8 local_80;
  sunrealtype local_78;
  double local_70;
  FILE *local_68;
  FILE *local_60;
  double local_58;
  int local_4c;
  N_Vector local_48;
  long local_40;
  long local_38;
  
  local_88 = 0.0;
  local_78 = 0.0;
  local_80 = 0;
  local_90 = (void *)0x0;
  uVar3 = SUNContext_Create(0);
  if ((int)uVar3 < 0) {
    pcVar10 = "SUNContext_Create";
  }
  else {
    udata = (UserData)malloc(0x38);
    if (udata == (UserData)0x0) {
      main_cold_6();
      return 1;
    }
    udata->alpha = 1.0;
    udata->orbits = 100;
    udata->torbit = 6.283185307179586;
    udata->rtol = 0.0001;
    udata->atol = 1e-09;
    udata->proj = 1;
    udata->projerr = 0;
    udata->tstop = 0;
    udata->nout = 0;
    if (1 < argc) {
      iVar11 = 1;
      do {
        pcVar10 = argv[iVar11];
        iVar4 = strcmp(pcVar10,"--alpha");
        if (iVar4 == 0) {
          dVar1 = atof(argv[(long)iVar11 + 1]);
          udata->alpha = dVar1;
          udata->torbit = 6.283185307179586 / dVar1;
          iVar11 = iVar11 + 2;
        }
        else {
          iVar4 = strcmp(pcVar10,"--orbits");
          if (iVar4 == 0) {
            iVar4 = atoi(argv[(long)iVar11 + 1]);
            udata->orbits = iVar4;
            iVar11 = iVar11 + 2;
          }
          else {
            iVar4 = strcmp(pcVar10,"--rtol");
            if (iVar4 == 0) {
              dVar1 = atof(argv[(long)iVar11 + 1]);
              udata->rtol = dVar1;
              iVar11 = iVar11 + 2;
            }
            else {
              iVar4 = strcmp(pcVar10,"--atol");
              if (iVar4 == 0) {
                dVar1 = atof(argv[(long)iVar11 + 1]);
                udata->atol = dVar1;
                iVar11 = iVar11 + 2;
              }
              else {
                iVar4 = strcmp(pcVar10,"--proj");
                if (iVar4 == 0) {
                  iVar4 = atoi(argv[(long)iVar11 + 1]);
                  udata->proj = iVar4;
                  iVar11 = iVar11 + 2;
                }
                else {
                  iVar4 = strcmp(pcVar10,"--projerr");
                  if (iVar4 == 0) {
                    iVar4 = atoi(argv[(long)iVar11 + 1]);
                    udata->projerr = iVar4;
                    iVar11 = iVar11 + 2;
                  }
                  else {
                    iVar4 = strcmp(pcVar10,"--nout");
                    if (iVar4 == 0) {
                      iVar4 = atoi(argv[(long)iVar11 + 1]);
                      udata->nout = iVar4;
                      iVar11 = iVar11 + 2;
                    }
                    else {
                      iVar4 = strcmp(pcVar10,"--tstop");
                      if (iVar4 != 0) {
                        iVar11 = strcmp(pcVar10,"--help");
                        if (iVar11 == 0) {
                          InputHelp();
                        }
                        else {
                          main_cold_1();
                        }
                        uVar9 = 0xffffffff;
                        bVar2 = true;
                        goto LAB_001026fe;
                      }
                      udata->tstop = 1;
                      iVar11 = iVar11 + 1;
                    }
                  }
                }
              }
            }
          }
        }
      } while (iVar11 < argc);
    }
    bVar2 = false;
    uVar9 = 0;
    if (udata->proj == 0) {
      udata->projerr = 0;
      bVar2 = false;
      uVar9 = 0;
    }
LAB_001026fe:
    if (bVar2) {
      pcVar10 = "InitUserData";
      goto LAB_00102d06;
    }
    y = (N_Vector)N_VNew_Serial(2,local_80);
    if (y == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    puVar5 = (undefined8 *)N_VGetArrayPointer(y);
    *puVar5 = 0x3ff0000000000000;
    puVar5[1] = 0;
    p_Var6 = (N_Vector)N_VClone(y);
    N_VConst(0,p_Var6);
    local_90 = (void *)CVodeCreate(2,local_80);
    if (local_90 == (void *)0x0) {
      main_cold_4();
      return 1;
    }
    uVar3 = CVodeInit(SUB84(local_88,0),local_90,f,y);
    if ((int)uVar3 < 0) {
      pcVar10 = "CVodeInit";
    }
    else {
      uVar3 = CVodeSetUserData(local_90,udata);
      if ((int)uVar3 < 0) {
        pcVar10 = "CVodeSetUserData";
      }
      else {
        uVar3 = CVodeSStolerances(SUB84(udata->rtol,0),local_90);
        if ((int)uVar3 < 0) {
          pcVar10 = "CVodeSStolerances";
        }
        else {
          lVar7 = SUNDenseMatrix(2,2,local_80);
          if (lVar7 == 0) {
            main_cold_3();
            return 1;
          }
          lVar8 = SUNLinSol_Dense(y,lVar7,local_80);
          if (lVar8 == 0) {
            main_cold_2();
            return 1;
          }
          uVar3 = CVodeSetLinearSolver(local_90,lVar8,lVar7);
          if ((int)uVar3 < 0) {
            pcVar10 = "CVodeSetLinearSolver";
          }
          else {
            uVar3 = CVodeSetJacFn(local_90,Jac);
            if ((int)uVar3 < 0) {
              pcVar10 = "CVodeSetJacFn";
            }
            else if (udata->proj == 0) {
LAB_0010285d:
              uVar3 = CVodeSetMaxNumSteps(local_90,100000);
              if (-1 < (int)uVar3) {
                local_38 = lVar8;
                uVar3 = PrintUserData(udata);
                if ((int)uVar3 < 0) {
                  pcVar10 = "PrintUserData";
                }
                else {
                  local_60 = (FILE *)0x0;
                  printf("\n     t            x              y");
                  puts("             err x          err y       err constr");
                  WriteOutput(local_88,y,p_Var6,0.0,0,(FILE *)0x0,(FILE *)0x0);
                  local_68 = (FILE *)0x0;
                  if (0 < udata->nout) {
                    YFID = fopen("cvsParticle_solution.txt","w");
                    local_68 = fopen("cvsParticle_error.txt","w");
                    local_60 = YFID;
                    WriteOutput(local_88,y,p_Var6,0.0,1,(FILE *)YFID,(FILE *)local_68);
                  }
                  iVar11 = udata->nout;
                  if (iVar11 < 1) {
                    local_70 = (double)udata->orbits * udata->torbit;
                    iVar4 = 1;
                  }
                  else {
                    iVar4 = iVar11 * udata->orbits;
                    local_70 = udata->torbit / (double)iVar11;
                  }
                  local_48 = p_Var6;
                  local_40 = lVar7;
                  if (0 < iVar4) {
                    local_4c = iVar4 + -1;
                    iVar11 = 0;
                    dVar1 = local_70;
                    do {
                      uVar12 = SUB84(dVar1,0);
                      local_58 = dVar1;
                      if ((udata->tstop != 0) || (udata->nout == 0)) {
                        uVar3 = CVodeSetStopTime(uVar12,local_90);
                        uVar12 = SUB84(local_58,0);
                        if ((int)uVar3 < 0) {
                          pcVar10 = "CVodeSetStopTime";
                          goto LAB_00102d04;
                        }
                      }
                      uVar3 = CVode(uVar12,local_90,y,&local_88,1);
                      p_Var6 = local_48;
                      if ((int)uVar3 < 0) {
                        fprintf(_stderr,"\nERROR: %s() returned = %d\n\n","CVode",(ulong)uVar3);
                        break;
                      }
                      if (0 < udata->nout) {
                        uVar3 = ComputeError(local_88,y,local_48,&local_78,udata);
                        WriteOutput(local_88,y,p_Var6,local_78,1,(FILE *)local_60,(FILE *)local_68);
                      }
                      if (iVar11 < local_4c) {
                        dVar1 = local_58 + local_70;
                      }
                      else {
                        dVar1 = (double)udata->orbits * udata->torbit;
                      }
                      iVar11 = iVar11 + 1;
                    } while (iVar4 != iVar11);
                  }
                  if (0 < udata->nout) {
                    fclose(local_60);
                    fclose(local_68);
                  }
                  p_Var6 = local_48;
                  ComputeError(local_88,y,local_48,&local_78,udata);
                  if (-1 < (int)uVar3) {
                    WriteOutput(local_88,y,p_Var6,local_78,0,(FILE *)0x0,(FILE *)0x0);
                    PrintStats(local_90);
                    free(udata);
                    N_VDestroy(y);
                    N_VDestroy(p_Var6);
                    SUNMatDestroy(local_40);
                    SUNLinSolFree(local_38);
                    CVodeFree(&local_90);
                    SUNContext_Free(&local_80);
                    return 0;
                  }
                  pcVar10 = "ComputeError";
                }
                uVar9 = (ulong)uVar3;
                goto LAB_00102d06;
              }
              pcVar10 = "CVodeSetMaxNumSteps";
            }
            else {
              uVar3 = CVodeSetProjFn(local_90,Proj);
              if ((int)uVar3 < 0) {
                pcVar10 = "CVodeSetProjFn";
              }
              else {
                uVar3 = CVodeSetProjErrEst(local_90,udata->projerr);
                if (-1 < (int)uVar3) goto LAB_0010285d;
                pcVar10 = "CVodeSetProjErrEst";
              }
            }
          }
        }
      }
    }
  }
LAB_00102d04:
  uVar9 = (ulong)uVar3;
LAB_00102d06:
  fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar10,uVar9);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  int retval;               /* reusable return flag       */
  int out           = 0;    /* output counter             */
  int totalout      = 0;    /* output counter             */
  sunrealtype t     = ZERO; /* current integration time   */
  sunrealtype dtout = ZERO; /* output spacing             */
  sunrealtype tout  = ZERO; /* next output time           */
  sunrealtype ec    = ZERO; /* constraint error           */
  UserData udata    = NULL; /* user data structure        */

  SUNContext sunctx  = NULL; /* SUNDIALS context     */
  void* cvode_mem    = NULL; /* CVODES memory        */
  N_Vector y         = NULL; /* solution vector      */
  sunrealtype* ydata = NULL; /* solution vector data */
  N_Vector e         = NULL; /* error vector         */
  SUNMatrix A        = NULL; /* Jacobian matrix      */
  SUNLinearSolver LS = NULL; /* linear solver        */

  FILE* YFID = NULL; /* solution output file */
  FILE* EFID = NULL; /* error output file    */

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data structure */
  udata = (UserData)malloc(sizeof *udata);
  if (check_retval((void*)udata, "malloc", 0)) { return (1); }

  retval = InitUserData(&argc, &argv, udata);
  if (check_retval(&retval, "InitUserData", 1)) { return (1); }

  /* Create serial vector to store the solution */
  y = N_VNew_Serial(2, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Set initial contion */
  ydata    = N_VGetArrayPointer(y);
  ydata[0] = ONE;
  ydata[1] = ZERO;

  /* Create serial vector to store the solution error */
  e = N_VClone(y);
  if (check_retval((void*)y, "N_VClone", 0)) { return (1); }

  /* Set initial error */
  N_VConst(ZERO, e);

  /* Create CVODES memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODES */
  retval = CVodeInit(cvode_mem, f, t, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Attach user-defined data structure to CVODES */
  retval = CVodeSetUserData(cvode_mem, udata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Set integration tolerances */
  retval = CVodeSStolerances(cvode_mem, udata->rtol, udata->atol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(2, 2, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODES */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set a user-supplied Jacobian function */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Set a user-supplied projection function */
  if (udata->proj)
  {
    retval = CVodeSetProjFn(cvode_mem, Proj);
    if (check_retval(&retval, "CVodeSetProjFn", 1)) { return (1); }

    retval = CVodeSetProjErrEst(cvode_mem, udata->projerr);
    if (check_retval(&retval, "CVodeSetProjErrEst", 1)) { return (1); }
  }

  /* Set max steps between outputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Output problem setup */
  retval = PrintUserData(udata);
  if (check_retval(&retval, "PrintUserData", 1)) { return (1); }

  /* Output initial condition */
  printf("\n     t            x              y");
  printf("             err x          err y       err constr\n");
  WriteOutput(t, y, e, ec, 0, NULL, NULL);

  if (udata->nout > 0)
  {
    YFID = fopen("cvsParticle_solution.txt", "w");
    EFID = fopen("cvsParticle_error.txt", "w");
    WriteOutput(t, y, e, ec, 1, YFID, EFID);
  }

  /* Integrate in time and periodically output the solution and error */
  if (udata->nout > 0)
  {
    totalout = udata->orbits * udata->nout;
    dtout    = udata->torbit / udata->nout;
  }
  else
  {
    totalout = 1;
    dtout    = udata->torbit * udata->orbits;
  }
  tout = dtout;

  for (out = 0; out < totalout; out++)
  {
    /* Stop at output time (do not interpolate output) */
    if (udata->tstop || udata->nout == 0)
    {
      retval = CVodeSetStopTime(cvode_mem, tout);
      if (check_retval(&retval, "CVodeSetStopTime", 1)) { return (1); }
    }

    /* Advance in time */
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }

    /* Output solution and error */
    if (udata->nout > 0)
    {
      retval = ComputeError(t, y, e, &ec, udata);
      if (check_retval(&retval, "ComputeError", 1)) { break; }

      WriteOutput(t, y, e, ec, 1, YFID, EFID);
      if (check_retval(&retval, "WriteOutput", 1)) { break; }
    }

    /* Update output time */
    if (out < totalout - 1) { tout += dtout; }
    else { tout = udata->torbit * udata->orbits; }
  }

  /* Close output files */
  if (udata->nout > 0)
  {
    fclose(YFID);
    fclose(EFID);
  }

  /* Output final solution and error to screen */
  ComputeError(t, y, e, &ec, udata);
  if (check_retval(&retval, "ComputeError", 1)) { return (1); }

  WriteOutput(t, y, e, ec, 0, NULL, NULL);
  if (check_retval(&retval, "WriteOutput", 1)) { return (1); }

  /* Print some final statistics */
  PrintStats(cvode_mem);

  /* Free memory */
  free(udata);
  N_VDestroy(y);
  N_VDestroy(e);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}